

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rips_complex.h
# Opt level: O0

void __thiscall
Gudhi::rips_complex::Rips_complex<float>::
create_complex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
          (Rips_complex<float> *this,
          Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *complex,int dim_max)

{
  size_t sVar1;
  invalid_argument *this_00;
  int dim_max_local;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *complex_local;
  Rips_complex<float> *this_local;
  
  sVar1 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_vertices(complex);
  if (sVar1 == 0) {
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
    insert_graph<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>>
              (complex,&this->rips_skeleton_graph_);
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::expansion(complex,dim_max);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"Rips_complex::create_complex - simplicial complex is not empty");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void create_complex(SimplicialComplexForRips& complex, int dim_max) {
    GUDHI_CHECK(complex.num_vertices() == 0,
                std::invalid_argument("Rips_complex::create_complex - simplicial complex is not empty"));

    // insert the proximity graph in the simplicial complex
    complex.insert_graph(rips_skeleton_graph_);
    // expand the graph until dimension dim_max
    complex.expansion(dim_max);
  }